

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::TailoredSet::compare(TailoredSet *this,UChar32 c,uint32_t ce32,uint32_t baseCE32)

{
  CollationData *pCVar1;
  int64_t *piVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  int64_t *piVar5;
  UBool UVar6;
  int32_t iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  UChar *pUVar13;
  UChar *pUVar14;
  UChar local_ae;
  int32_t length_2;
  UChar UStack_a8;
  UChar jamos [3];
  int32_t i_1;
  int32_t baseLength_1;
  int64_t *baseCEs;
  int32_t length_1;
  int64_t *ces;
  int32_t i;
  int32_t baseLength;
  uint32_t *baseCE32s;
  int32_t length;
  uint32_t *ce32s;
  uint32_t p_2;
  int64_t dataCE;
  int32_t baseTag;
  int32_t tag;
  UChar *q_3;
  UChar *q_2;
  UChar *p_1;
  UChar *q_1;
  UChar *q;
  UChar *p;
  uint32_t local_18;
  uint32_t baseCE32_local;
  uint32_t ce32_local;
  UChar32 c_local;
  TailoredSet *this_local;
  
  UVar6 = Collation::isPrefixCE32(ce32);
  p._4_4_ = baseCE32;
  if (UVar6 == '\0') {
    UVar6 = Collation::isPrefixCE32(baseCE32);
    local_18 = ce32;
    if (UVar6 != '\0') {
      pUVar14 = this->baseData->contexts;
      iVar7 = Collation::indexFromCE32(baseCE32);
      pUVar14 = pUVar14 + iVar7;
      pCVar1 = this->baseData;
      uVar8 = CollationData::readCE32(pUVar14);
      p._4_4_ = CollationData::getFinalCE32(pCVar1,uVar8);
      addPrefixes(this,this->baseData,c,pUVar14 + 2);
    }
  }
  else {
    pUVar14 = this->data->contexts;
    iVar7 = Collation::indexFromCE32(ce32);
    pUVar14 = pUVar14 + iVar7;
    pCVar1 = this->data;
    uVar8 = CollationData::readCE32(pUVar14);
    local_18 = CollationData::getFinalCE32(pCVar1,uVar8);
    UVar6 = Collation::isPrefixCE32(baseCE32);
    if (UVar6 == '\0') {
      addPrefixes(this,this->data,c,pUVar14 + 2);
    }
    else {
      pUVar13 = this->baseData->contexts;
      iVar7 = Collation::indexFromCE32(baseCE32);
      pUVar13 = pUVar13 + iVar7;
      pCVar1 = this->baseData;
      uVar8 = CollationData::readCE32(pUVar13);
      p._4_4_ = CollationData::getFinalCE32(pCVar1,uVar8);
      comparePrefixes(this,c,pUVar14 + 2,pUVar13 + 2);
    }
  }
  UVar6 = Collation::isContractionCE32(local_18);
  if (UVar6 == '\0') {
    UVar6 = Collation::isContractionCE32(p._4_4_);
    if (UVar6 != '\0') {
      pUVar14 = this->baseData->contexts;
      iVar7 = Collation::indexFromCE32(p._4_4_);
      pUVar14 = pUVar14 + iVar7;
      pCVar1 = this->baseData;
      uVar8 = CollationData::readCE32(pUVar14);
      p._4_4_ = CollationData::getFinalCE32(pCVar1,uVar8);
      addContractions(this,c,pUVar14 + 2);
    }
  }
  else {
    pUVar14 = this->data->contexts;
    iVar7 = Collation::indexFromCE32(local_18);
    pUVar14 = pUVar14 + iVar7;
    if ((local_18 & 0x100) == 0) {
      pCVar1 = this->data;
      uVar8 = CollationData::readCE32(pUVar14);
      local_18 = CollationData::getFinalCE32(pCVar1,uVar8);
    }
    else {
      local_18 = 1;
    }
    UVar6 = Collation::isContractionCE32(p._4_4_);
    if (UVar6 == '\0') {
      addContractions(this,c,pUVar14 + 2);
    }
    else {
      pUVar13 = this->baseData->contexts;
      iVar7 = Collation::indexFromCE32(p._4_4_);
      pUVar13 = pUVar13 + iVar7;
      if ((p._4_4_ & 0x100) == 0) {
        pCVar1 = this->baseData;
        uVar8 = CollationData::readCE32(pUVar13);
        p._4_4_ = CollationData::getFinalCE32(pCVar1,uVar8);
      }
      else {
        p._4_4_ = 1;
      }
      compareContractions(this,c,pUVar14 + 2,pUVar13 + 2);
    }
  }
  UVar6 = Collation::isSpecialCE32(local_18);
  if (UVar6 == '\0') {
    dataCE._4_4_ = -1;
  }
  else {
    dataCE._4_4_ = Collation::tagFromCE32(local_18);
  }
  UVar6 = Collation::isSpecialCE32(p._4_4_);
  if (UVar6 == '\0') {
    dataCE._0_4_ = -1;
  }
  else {
    dataCE._0_4_ = Collation::tagFromCE32(p._4_4_);
  }
  if ((int32_t)dataCE == 0xe) {
    UVar6 = Collation::isLongPrimaryCE32(local_18);
    if (UVar6 == '\0') {
      add(this,c);
      return;
    }
    piVar2 = this->baseData->ces;
    iVar7 = Collation::indexFromCE32(p._4_4_);
    uVar8 = Collation::getThreeBytePrimaryForOffsetData(c,piVar2[iVar7]);
    uVar9 = Collation::primaryFromLongPrimaryCE32(local_18);
    if (uVar9 != uVar8) {
      add(this,c);
      return;
    }
  }
  if (dataCE._4_4_ == (int32_t)dataCE) {
    if (dataCE._4_4_ == 5) {
      puVar3 = this->data->ce32s;
      iVar7 = Collation::indexFromCE32(local_18);
      iVar10 = Collation::lengthFromCE32(local_18);
      puVar4 = this->baseData->ce32s;
      iVar11 = Collation::indexFromCE32(p._4_4_);
      iVar12 = Collation::lengthFromCE32(p._4_4_);
      if (iVar10 == iVar12) {
        for (ces._0_4_ = 0; (int)ces < iVar10; ces._0_4_ = (int)ces + 1) {
          if (puVar3[(long)iVar7 + (long)(int)ces] != puVar4[(long)iVar11 + (long)(int)ces]) {
            add(this,c);
            return;
          }
        }
      }
      else {
        add(this,c);
      }
    }
    else if (dataCE._4_4_ == 6) {
      piVar2 = this->data->ces;
      iVar7 = Collation::indexFromCE32(local_18);
      iVar10 = Collation::lengthFromCE32(local_18);
      piVar5 = this->baseData->ces;
      iVar11 = Collation::indexFromCE32(p._4_4_);
      jamos._2_4_ = Collation::lengthFromCE32(p._4_4_);
      if (iVar10 == jamos._2_4_) {
        UStack_a8 = L'\0';
        jamos[0] = L'\0';
        for (; _UStack_a8 < iVar10; _UStack_a8 = _UStack_a8 + 1) {
          if (piVar2[(long)iVar7 + (long)_UStack_a8] != piVar5[(long)iVar11 + (long)_UStack_a8]) {
            add(this,c);
            return;
          }
        }
      }
      else {
        add(this,c);
      }
    }
    else if (dataCE._4_4_ == 0xc) {
      iVar7 = Hangul::decompose(c,&local_ae);
      UVar6 = UnicodeSet::contains(this->tailored,(uint)(ushort)local_ae);
      if (((UVar6 != '\0') ||
          (UVar6 = UnicodeSet::contains(this->tailored,(uint)(ushort)length_2), UVar6 != '\0')) ||
         ((iVar7 == 3 &&
          (UVar6 = UnicodeSet::contains(this->tailored,(uint)length_2._2_2_), UVar6 != '\0')))) {
        add(this,c);
      }
    }
    else if (local_18 != p._4_4_) {
      add(this,c);
    }
  }
  else {
    add(this,c);
  }
  return;
}

Assistant:

void
TailoredSet::compare(UChar32 c, uint32_t ce32, uint32_t baseCE32) {
    if(Collation::isPrefixCE32(ce32)) {
        const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
        ce32 = data->getFinalCE32(CollationData::readCE32(p));
        if(Collation::isPrefixCE32(baseCE32)) {
            const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
            baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
            comparePrefixes(c, p + 2, q + 2);
        } else {
            addPrefixes(data, c, p + 2);
        }
    } else if(Collation::isPrefixCE32(baseCE32)) {
        const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
        baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
        addPrefixes(baseData, c, q + 2);
    }

    if(Collation::isContractionCE32(ce32)) {
        const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
        if((ce32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
            ce32 = Collation::NO_CE32;
        } else {
            ce32 = data->getFinalCE32(CollationData::readCE32(p));
        }
        if(Collation::isContractionCE32(baseCE32)) {
            const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
            if((baseCE32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
                baseCE32 = Collation::NO_CE32;
            } else {
                baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
            }
            compareContractions(c, p + 2, q + 2);
        } else {
            addContractions(c, p + 2);
        }
    } else if(Collation::isContractionCE32(baseCE32)) {
        const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
        baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
        addContractions(c, q + 2);
    }

    int32_t tag;
    if(Collation::isSpecialCE32(ce32)) {
        tag = Collation::tagFromCE32(ce32);
        U_ASSERT(tag != Collation::PREFIX_TAG);
        U_ASSERT(tag != Collation::CONTRACTION_TAG);
        // Currently, the tailoring data builder does not write offset tags.
        // They might be useful for saving space,
        // but they would complicate the builder,
        // and in tailorings we assume that performance of tailored characters is more important.
        U_ASSERT(tag != Collation::OFFSET_TAG);
    } else {
        tag = -1;
    }
    int32_t baseTag;
    if(Collation::isSpecialCE32(baseCE32)) {
        baseTag = Collation::tagFromCE32(baseCE32);
        U_ASSERT(baseTag != Collation::PREFIX_TAG);
        U_ASSERT(baseTag != Collation::CONTRACTION_TAG);
    } else {
        baseTag = -1;
    }

    // Non-contextual mappings, expansions, etc.
    if(baseTag == Collation::OFFSET_TAG) {
        // We might be comparing a tailoring CE which is a copy of
        // a base offset-tag CE, via the [optimize [set]] syntax
        // or when a single-character mapping was copied for tailored contractions.
        // Offset tags always result in long-primary CEs,
        // with common secondary/tertiary weights.
        if(!Collation::isLongPrimaryCE32(ce32)) {
            add(c);
            return;
        }
        int64_t dataCE = baseData->ces[Collation::indexFromCE32(baseCE32)];
        uint32_t p = Collation::getThreeBytePrimaryForOffsetData(c, dataCE);
        if(Collation::primaryFromLongPrimaryCE32(ce32) != p) {
            add(c);
            return;
        }
    }

    if(tag != baseTag) {
        add(c);
        return;
    }

    if(tag == Collation::EXPANSION32_TAG) {
        const uint32_t *ce32s = data->ce32s + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);

        const uint32_t *baseCE32s = baseData->ce32s + Collation::indexFromCE32(baseCE32);
        int32_t baseLength = Collation::lengthFromCE32(baseCE32);

        if(length != baseLength) {
            add(c);
            return;
        }
        for(int32_t i = 0; i < length; ++i) {
            if(ce32s[i] != baseCE32s[i]) {
                add(c);
                break;
            }
        }
    } else if(tag == Collation::EXPANSION_TAG) {
        const int64_t *ces = data->ces + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);

        const int64_t *baseCEs = baseData->ces + Collation::indexFromCE32(baseCE32);
        int32_t baseLength = Collation::lengthFromCE32(baseCE32);

        if(length != baseLength) {
            add(c);
            return;
        }
        for(int32_t i = 0; i < length; ++i) {
            if(ces[i] != baseCEs[i]) {
                add(c);
                break;
            }
        }
    } else if(tag == Collation::HANGUL_TAG) {
        UChar jamos[3];
        int32_t length = Hangul::decompose(c, jamos);
        if(tailored->contains(jamos[0]) || tailored->contains(jamos[1]) ||
                (length == 3 && tailored->contains(jamos[2]))) {
            add(c);
        }
    } else if(ce32 != baseCE32) {
        add(c);
    }
}